

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

Vec_Int_t * Bac_NameToRanges(char *pName)

{
  char *__s2;
  int iVar1;
  size_t __n;
  bool bVar2;
  int local_1c;
  int Count;
  int Num;
  char *pTemp;
  char *pName_local;
  
  local_1c = 0;
  Bac_NameToRanges::vBits->pArray = Bac_NameToRanges::pArray;
  Bac_NameToRanges::vBits->nSize = 0;
  Bac_NameToRanges::vBits->nCap = 10;
  __s2 = s_Pref;
  __n = strlen(s_Pref);
  iVar1 = strncmp(pName,__s2,__n);
  _Count = pName;
  if (iVar1 != 0) {
    __assert_fail("!strncmp(pName, s_Pref, strlen(s_Pref))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xb7,"Vec_Int_t *Bac_NameToRanges(char *)");
  }
  while( true ) {
    bVar2 = false;
    if (*_Count != '\0') {
      iVar1 = Bac_CharIsDigit(*_Count);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    _Count = _Count + 1;
  }
  iVar1 = Bac_CharIsDigit(*_Count);
  if (iVar1 == 0) {
    __assert_fail("Bac_CharIsDigit(*pTemp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xb9,"Vec_Int_t *Bac_NameToRanges(char *)");
  }
  for (; *_Count != '\0'; _Count = _Count + 1) {
    iVar1 = Bac_CharIsDigit(*_Count);
    if (iVar1 == 0) {
      Vec_IntPush(Bac_NameToRanges::vBits,local_1c);
      local_1c = 0;
    }
    else {
      local_1c = local_1c * 10 + (int)*_Count + -0x30;
    }
  }
  if (local_1c < 1) {
    __assert_fail("Num > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xc1,"Vec_Int_t *Bac_NameToRanges(char *)");
  }
  Vec_IntPush(Bac_NameToRanges::vBits,local_1c);
  iVar1 = Vec_IntSize(Bac_NameToRanges::vBits);
  if (10 < iVar1) {
    __assert_fail("Vec_IntSize(vBits) <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xc3,"Vec_Int_t *Bac_NameToRanges(char *)");
  }
  return Bac_NameToRanges::vBits;
}

Assistant:

Vec_Int_t * Bac_NameToRanges( char * pName )
{
    static Vec_Int_t Bits, * vBits = &Bits;
    static int pArray[10];
    char * pTemp; 
    int Num = 0, Count = 0;
    // initialize array
    vBits->pArray = pArray;
    vBits->nSize = 0;
    vBits->nCap = 10;
    // check the name
    assert( !strncmp(pName, s_Pref, strlen(s_Pref)) );
    for ( pTemp = pName; *pTemp && !Bac_CharIsDigit(*pTemp); pTemp++ );
    assert( Bac_CharIsDigit(*pTemp) );
    for ( ; *pTemp; pTemp++ )
    {
        if ( Bac_CharIsDigit(*pTemp) )
            Num = 10 * Num + *pTemp - '0';
        else
            Vec_IntPush( vBits, Num ), Count += Num, Num = 0;
    }
    assert( Num > 0 );
    Vec_IntPush( vBits, Num );  Count += Num;
    assert( Vec_IntSize(vBits) <= 10 );
    return vBits;
}